

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O3

Value __thiscall
MiniScript::Parser::ParseAddSub(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  bool *pbVar1;
  long *plVar2;
  int iVar3;
  ParseState *this_00;
  long *plVar4;
  Value *pVVar5;
  bool bVar6;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data aVar7;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX_02;
  anon_union_8_3_2f476f46_for_data extraout_RDX_03;
  anon_union_8_3_2f476f46_for_data extraout_RDX_04;
  undefined4 in_R8D;
  Value VVar8;
  Value opB;
  Token tok;
  undefined1 local_168 [8];
  RefCountedStorage *local_160;
  undefined4 local_154;
  Value local_150;
  bool local_140 [8];
  ParseState *local_138;
  Value local_130;
  Value local_120;
  Token local_110;
  Lexer local_f0;
  Value *local_e8;
  Lexer local_e0;
  Lexer local_d8;
  Token local_d0;
  TACLine local_b0;
  Token local_50;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_f0.ls = this_01->ls;
  if (local_f0.ls != (LexerStorage *)0x0) {
    (local_f0.ls)->refCount = (local_f0.ls)->refCount + 1;
  }
  local_154 = in_R8D;
  ParseMultDiv(this,tokens,SUB81(&local_f0,0),statementStart);
  local_e8 = (Value *)tokens;
  Lexer::release(&local_f0);
  Lexer::Peek(&local_d0,this_01);
  aVar7 = extraout_RDX;
  do {
    if (local_d0.type != OpPlus) {
      if (local_d0.type != OpMinus) {
LAB_0016d9fa:
        if ((local_d0.text.ss != (StringStorage *)0x0) && (local_d0.text.isTemp == false)) {
          plVar4 = &((local_d0.text.ss)->super_RefCountedStorage).refCount;
          *plVar4 = *plVar4 + -1;
          if (*plVar4 == 0) {
            (*((local_d0.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
            aVar7 = extraout_RDX_04;
          }
        }
        VVar8.data.number = aVar7.number;
        VVar8._0_8_ = this;
        return VVar8;
      }
      if (((char)local_154 != '\0') && (local_d0.afterSpace == true)) {
        bVar6 = Lexer::isAtWhitespace(this_01);
        aVar7 = extraout_RDX_00;
        if (!bVar6) goto LAB_0016d9fa;
      }
    }
    Lexer::Dequeue(&local_50,this_01);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar4 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_d8.ls = this_01->ls;
    if (local_d8.ls != (LexerStorage *)0x0) {
      (local_d8.ls)->refCount = (local_d8.ls)->refCount + 1;
    }
    AllowLineBreak(&local_d8);
    Lexer::release(&local_d8);
    local_140[0] = *(bool *)&(this->errorContext).ss;
    local_140[1] = *(bool *)((long)&(this->errorContext).ss + 1);
    local_140[2] = *(bool *)((long)&(this->errorContext).ss + 2);
    local_138 = *(ParseState **)&(this->errorContext).isTemp;
    if (local_138 != (ParseState *)0x0 && 2 < local_140[0]) {
      pbVar1 = &(local_138->code).isTemp;
      *(long *)pbVar1 = *(long *)pbVar1 + 1;
    }
    FullyEvaluate((Parser *)local_168,local_e8,(LocalOnlyMode)local_140);
    Value::operator=((Value *)this,(Value *)local_168);
    if ((Temp < local_168[0]) && (local_160 != (RefCountedStorage *)0x0)) {
      plVar4 = &local_160->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*local_160->_vptr_RefCountedStorage[1])();
      }
      local_160 = (RefCountedStorage *)0x0;
    }
    if ((2 < local_140[0]) && (local_138 != (ParseState *)0x0)) {
      pbVar1 = &(local_138->code).isTemp;
      *(long *)pbVar1 = *(long *)pbVar1 + -1;
      if (*(long *)pbVar1 == 0) {
        (*(code *)(((local_138->code).ls)->super_RefCountedStorage).refCount)();
      }
      local_138 = (ParseState *)0x0;
    }
    pVVar5 = local_e8;
    local_e0.ls = this_01->ls;
    if (local_e0.ls != (LexerStorage *)0x0) {
      (local_e0.ls)->refCount = (local_e0.ls)->refCount + 1;
    }
    ParseMultDiv((Parser *)local_168,(Lexer *)local_e8,SUB81(&local_e0,0),false);
    Lexer::release(&local_e0);
    this_00 = *(ParseState **)(pVVar5 + 3);
    iVar3 = this_00->nextTempNum;
    this_00->nextTempNum = iVar3 + 1;
    local_120.type = Temp;
    local_120.noInvoke = false;
    local_120.localOnly = Off;
    local_120.data.tempNum = iVar3;
    local_150.type = *(ValueType *)&(this->errorContext).ss;
    local_150.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
    local_150.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
    local_150.data =
         (anon_union_8_3_2f476f46_for_data)
         *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
    if ((StringStorage *)local_150.data.ref != (StringStorage *)0x0 && 2 < local_150.type) {
      (local_150.data.ref)->refCount = (local_150.data.ref)->refCount + 1;
    }
    local_130.type = local_168[0];
    local_130.noInvoke = (bool)local_168[1];
    local_130.localOnly = local_168[2];
    local_130.data.ref = local_160;
    if (local_160 != (RefCountedStorage *)0x0 && Temp < local_168[0]) {
      local_160->refCount = local_160->refCount + 1;
    }
    TACLine::TACLine(&local_b0,&local_120,(local_d0.type != OpPlus) + APlusB,&local_150,&local_130);
    ParseState::Add(this_00,&local_b0);
    if ((local_b0.location.context.ss != (StringStorage *)0x0) &&
       (local_b0.location.context.isTemp == false)) {
      plVar4 = &((local_b0.location.context.ss)->super_RefCountedStorage).refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*((local_b0.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.location.context.ss = (StringStorage *)0x0;
    }
    if ((local_b0.comment.ss != (StringStorage *)0x0) && (local_b0.comment.isTemp == false)) {
      plVar4 = &((local_b0.comment.ss)->super_RefCountedStorage).refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*((local_b0.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.comment.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_b0.rhsB.type) && (local_b0.rhsB.data.ref != (RefCountedStorage *)0x0)) {
      plVar4 = &(local_b0.rhsB.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*(local_b0.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.rhsB.data.number = 0.0;
    }
    if ((Temp < local_b0.rhsA.type) && (local_b0.rhsA.data.ref != (RefCountedStorage *)0x0)) {
      plVar4 = &(local_b0.rhsA.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*(local_b0.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.rhsA.data.number = 0.0;
    }
    if ((Temp < local_b0.lhs.type) && (local_b0.lhs.data.ref != (RefCountedStorage *)0x0)) {
      plVar4 = &(local_b0.lhs.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*(local_b0.lhs.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.lhs.data.number = 0.0;
    }
    if ((Temp < local_130.type) && (local_130.data.ref != (RefCountedStorage *)0x0)) {
      plVar4 = &(local_130.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*(local_130.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_130.data.number = 0.0;
    }
    if ((2 < local_150.type) && ((StringStorage *)local_150.data.ref != (StringStorage *)0x0)) {
      plVar4 = &(local_150.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*((RefCountedStorage *)&(local_150.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_150.data.number = 0.0;
    }
    if ((Temp < local_120.type) && (local_120.data.ref != (RefCountedStorage *)0x0)) {
      plVar4 = &(local_120.data.ref)->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*(local_120.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_120.data.number = 0.0;
    }
    local_110.type = CONCAT13(local_110.type._3_1_,2);
    local_110.text.ss._0_4_ = iVar3;
    Value::operator=((Value *)this,(Value *)&local_110);
    if ((Number < (byte)(undefined1)local_110.type) &&
       (plVar4 = (long *)CONCAT44(local_110.text.ss._4_4_,(int)local_110.text.ss),
       plVar4 != (long *)0x0)) {
      plVar2 = plVar4 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
    Lexer::Peek(&local_110,this_01);
    local_d0.type = local_110.type;
    String::operator=(&local_d0.text,&local_110.text);
    local_d0.afterSpace = local_110.afterSpace;
    plVar4 = (long *)CONCAT44(local_110.text.ss._4_4_,(int)local_110.text.ss);
    aVar7 = extraout_RDX_01;
    if ((plVar4 != (long *)0x0) && (local_110.text.isTemp == false)) {
      plVar2 = plVar4 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar4 + 8))();
        aVar7 = extraout_RDX_02;
      }
    }
    if ((Temp < local_168[0]) && (local_160 != (RefCountedStorage *)0x0)) {
      plVar4 = &local_160->refCount;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        (*local_160->_vptr_RefCountedStorage[1])();
        aVar7 = extraout_RDX_03;
      }
    }
  } while( true );
}

Assistant:

Value Parser::ParseAddSub(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMultDiv;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);
		Token tok = tokens.Peek();
		while (tok.type == Token::Type::OpPlus ||
			   (tok.type == Token::Type::OpMinus
				&& (!statementStart || !tok.afterSpace  || tokens.isAtWhitespace()))) {
			tokens.Dequeue();

			AllowLineBreak(tokens); // allow a line break after a binary operator
				   
			val = FullyEvaluate(val);
			Value opB = (*this.*nextLevel)(tokens, false, false);
			int tempNum = output->nextTempNum++;
			output->Add(TACLine(Value::Temp(tempNum),
							   tok.type == Token::Type::OpPlus ? TACLine::Op::APlusB : TACLine::Op::AMinusB,
							   val, opB));
			val = Value::Temp(tempNum);
			
			tok = tokens.Peek();
		}
		return val;
	}